

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void Curl_ssl_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  uint sock;
  char *fmt;
  
  pvVar1 = cf->ctx;
  if ((*(int *)((long)pvVar1 + 0xb4) == 0) ||
     (sock = Curl_conn_cf_get_socket(cf->next,data), sock == 0xffffffff)) {
    return;
  }
  if ((*(byte *)((long)pvVar1 + 0xb4) & 2) == 0) {
    Curl_pollset_change(data,ps,sock,1,2);
    if (data == (Curl_easy *)0x0) {
      return;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return;
    }
    pcVar2 = (data->state).feat;
    if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
      return;
    }
    if (cf->cft->log_level < 1) {
      return;
    }
    fmt = "adjust_pollset, POLLIN fd=%d";
  }
  else {
    Curl_pollset_change(data,ps,sock,2,1);
    if (data == (Curl_easy *)0x0) {
      return;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return;
    }
    pcVar2 = (data->state).feat;
    if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
      return;
    }
    if (cf->cft->log_level < 1) {
      return;
    }
    fmt = "adjust_pollset, POLLOUT fd=%d";
  }
  Curl_trc_cf_infof(data,cf,fmt,(ulong)sock);
  return;
}

Assistant:

void Curl_ssl_adjust_pollset(struct Curl_cfilter *cf, struct Curl_easy *data,
                              struct easy_pollset *ps)
{
  struct ssl_connect_data *connssl = cf->ctx;

  if(connssl->io_need) {
    curl_socket_t sock = Curl_conn_cf_get_socket(cf->next, data);
    if(sock != CURL_SOCKET_BAD) {
      if(connssl->io_need & CURL_SSL_IO_NEED_SEND) {
        Curl_pollset_set_out_only(data, ps, sock);
        CURL_TRC_CF(data, cf, "adjust_pollset, POLLOUT fd=%" FMT_SOCKET_T,
                    sock);
      }
      else {
        Curl_pollset_set_in_only(data, ps, sock);
        CURL_TRC_CF(data, cf, "adjust_pollset, POLLIN fd=%" FMT_SOCKET_T,
                    sock);
      }
    }
  }
}